

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O2

UBool icu_63::DateFormatSymbols::arrayCompare
                (UnicodeString *array1,UnicodeString *array2,int32_t count)

{
  UBool UVar1;
  int iVar2;
  UnicodeString *text;
  UnicodeString *this;
  
  UVar1 = '\x01';
  if (array1 != array2) {
    text = array2 + (uint)count;
    this = array1 + (uint)count;
    iVar2 = count + 1;
    do {
      this = this + -1;
      text = text + -1;
      iVar2 = iVar2 + -1;
      if (iVar2 < 1) {
        return '\x01';
      }
      UVar1 = icu_63::UnicodeString::operator!=(this,text);
    } while (UVar1 == '\0');
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

UBool
DateFormatSymbols::arrayCompare(const UnicodeString* array1,
                                const UnicodeString* array2,
                                int32_t count)
{
    if (array1 == array2) return TRUE;
    while (count>0)
    {
        --count;
        if (array1[count] != array2[count]) return FALSE;
    }
    return TRUE;
}